

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall SQCompilation::CheckerVisitor::visitBlock(CheckerVisitor *this,Block *b)

{
  pointer *ppSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  VarScope *pVVar4;
  iterator __position;
  Statement **ppSVar5;
  ulong uVar6;
  long lVar7;
  StackSlot local_88;
  VarScope local_78;
  
  checkForgottenDo(this,b);
  checkUnreachableCode(this,b);
  checkAssignedTwice(this,b);
  checkFunctionSimilarity(this,b);
  checkAssignExpressionSimilarity(this,b);
  pVVar4 = this->currentScope;
  if (pVVar4 == (VarScope *)0x0) {
    local_78.owner = (FunctionDecl *)0x0;
    local_78.evalId = 0;
    local_78.depth = 0;
  }
  else {
    local_78.owner = pVVar4->owner;
    uVar2 = pVVar4->evalId;
    uVar3 = pVVar4->depth;
    local_78.evalId = uVar2 + 1;
    local_78.depth = uVar3 + 1;
  }
  local_78.symbols._M_h._M_buckets = &local_78.symbols._M_h._M_single_bucket;
  local_78.symbols._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78.symbols._M_h._M_element_count = 0;
  local_78.symbols._M_h._M_rehash_policy._M_next_resize = 0;
  local_78.symbols._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_78.symbols._M_h._M_bucket_count = 1;
  local_78.symbols._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->currentScope = &local_78;
  local_88.sst = SST_NODE;
  __position._M_current =
       (this->nodeStack).
       super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.field_1 = (anon_union_8_2_108c9717_for_StackSlot_1)b;
  local_78.parent = pVVar4;
  if (__position._M_current ==
      (this->nodeStack).
      super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
    ::_M_realloc_insert<SQCompilation::CheckerVisitor::StackSlot>
              (&this->nodeStack,__position,&local_88);
  }
  else {
    *(ulong *)__position._M_current = (ulong)(uint)local_88._4_4_ << 0x20;
    ((__position._M_current)->field_1).n = (Node *)b;
    ppSVar1 = &(this->nodeStack).
               super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  uVar6 = (ulong)(b->_statements)._size;
  if (uVar6 != 0) {
    ppSVar5 = (b->_statements)._vals;
    lVar7 = 0;
    do {
      Node::visit<SQCompilation::CheckerVisitor>(*(Node **)((long)ppSVar5 + lVar7),this);
      local_78.evalId = local_78.evalId + 1;
      lVar7 = lVar7 + 8;
    } while (uVar6 << 3 != lVar7);
  }
  ppSVar1 = &(this->nodeStack).
             super__Vector_base<SQCompilation::CheckerVisitor::StackSlot,_std::allocator<SQCompilation::CheckerVisitor::StackSlot>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppSVar1 = *ppSVar1 + -1;
  local_78.parent = (VarScope *)0x0;
  VarScope::checkUnusedSymbols(&local_78,this);
  this->currentScope = pVVar4;
  VarScope::~VarScope(&local_78);
  return;
}

Assistant:

void CheckerVisitor::visitBlock(Block *b) {
  checkForgottenDo(b);
  checkUnreachableCode(b);
  checkAssignedTwice(b);
  checkFunctionSimilarity(b);
  checkAssignExpressionSimilarity(b);

  VarScope *thisScope = currentScope;
  VarScope blockScope(thisScope ? thisScope->owner : nullptr, thisScope);
  currentScope = &blockScope;

  nodeStack.push_back({ SST_NODE, b });

  for (Statement *s : b->statements()) {
    s->visit(this);
    blockScope.evalId += 1;
  }

  nodeStack.pop_back();

  blockScope.parent = nullptr;
  blockScope.checkUnusedSymbols(this);
  currentScope = thisScope;
}